

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

int disas_neon_insn_3same_ext(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  target_ulong tVar1;
  byte bVar2;
  bool bVar3;
  _Bool _Var4;
  uint32_t uVar5;
  long lVar6;
  bool bVar7;
  TCGv_ptr local_70;
  TCGv_ptr ptr;
  int is_s;
  _Bool u;
  int size_1;
  int size;
  _Bool ptr_is_env;
  _Bool q;
  uint32_t uStack_50;
  _Bool is_long;
  int off_rm;
  int off_rn;
  int data;
  int opr_sz;
  int rm;
  int rn;
  int rd;
  undefined1 *fn_gvec_ptr;
  gen_helper_gvec_3_conflict1 *fn_gvec;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  fn_gvec_ptr = (undefined1 *)0x0;
  _rn = (code *)0x0;
  off_rm = 0;
  bVar2 = 0;
  uVar5 = extract32(insn,6,1);
  bVar7 = uVar5 != 0;
  bVar3 = false;
  if ((insn & 0xfe200f10) == 0xfc200800) {
    uVar5 = extract32(insn,0x14,1);
    off_rm = extract32(insn,0x17,2);
    _Var4 = isar_feature_aa32_vcma(s->isar);
    if ((!_Var4) || ((uVar5 == 0 && (_Var4 = isar_feature_aa32_fp16_arith(s->isar), !_Var4)))) {
      return 1;
    }
    _rn = gen_helper_gvec_fcmlah;
    if (uVar5 != 0) {
      _rn = gen_helper_gvec_fcmlas;
    }
  }
  else if ((insn & 0xfea00f10) == 0xfc800800) {
    uVar5 = extract32(insn,0x14,1);
    off_rm = extract32(insn,0x18,1);
    _Var4 = isar_feature_aa32_vcma(s->isar);
    if ((!_Var4) || ((uVar5 == 0 && (_Var4 = isar_feature_aa32_fp16_arith(s->isar), !_Var4)))) {
      return 1;
    }
    _rn = gen_helper_gvec_fcaddh;
    if (uVar5 != 0) {
      _rn = gen_helper_gvec_fcadds;
    }
  }
  else if ((insn & 0xfeb00f00) == 0xfc200d00) {
    uVar5 = extract32(insn,4,1);
    _Var4 = isar_feature_aa32_dp(s->isar);
    if (!_Var4) {
      return 1;
    }
    fn_gvec_ptr = gen_helper_gvec_sdot_b;
    if (uVar5 != 0) {
      fn_gvec_ptr = gen_helper_gvec_udot_b;
    }
  }
  else {
    if ((insn & 0xff300f10) != 0xfc200810) {
      return 1;
    }
    off_rm = extract32(insn,0x17,1);
    _Var4 = isar_feature_aa32_fhm(s->isar);
    if (!_Var4) {
      return 1;
    }
    bVar2 = 1;
    _rn = gen_helper_gvec_fmlal_a32;
    bVar3 = true;
  }
  _Var4 = isar_feature_aa32_simd_r32(s->isar);
  if (_Var4) {
    rm = insn >> 0xc & 0xf | insn >> 0x12 & 0x10;
  }
  else {
    if ((insn & 0x400000) != 0) {
      return 1;
    }
    rm = insn >> 0xc & 0xf;
  }
  if ((rm & (uint)bVar7) == 0) {
    if ((bVar7) || (bVar2 == 0)) {
      _Var4 = isar_feature_aa32_simd_r32(s->isar);
      if (_Var4) {
        opr_sz = insn >> 0x10 & 0xf | insn >> 3 & 0x10;
      }
      else {
        if ((insn & 0x80) != 0) {
          return 1;
        }
        opr_sz = insn >> 0x10 & 0xf;
      }
      _Var4 = isar_feature_aa32_simd_r32(s->isar);
      if (_Var4) {
        data = insn & 0xf | insn >> 1 & 0x10;
      }
      else {
        if ((insn & 0x20) != 0) {
          return 1;
        }
        data = insn & 0xf;
      }
      if (((opr_sz | data) & (uint)bVar7 & (uint)(bVar2 ^ 1)) != 0) {
        return 1;
      }
      lVar6 = vfp_reg_offset(true,opr_sz);
      uStack_50 = (uint32_t)lVar6;
      lVar6 = vfp_reg_offset(true,data);
      size = (int)lVar6;
    }
    else {
      lVar6 = vfp_reg_offset(false,insn >> 0xf & 0x1e | insn >> 7 & 1);
      uStack_50 = (uint32_t)lVar6;
      lVar6 = vfp_reg_offset(false,(insn & 0xf) << 1 | insn >> 5 & 1);
      size = (int)lVar6;
    }
    if (s->fp_excp_el == 0) {
      if ((s->vfp_enabled & 1U) == 0) {
        s_local._4_4_ = 1;
      }
      else {
        uVar5 = (bVar7 + 1) * 8;
        if (_rn == (code *)0x0) {
          lVar6 = vfp_reg_offset(true,rm);
          tcg_gen_gvec_3_ool_aarch64
                    (tcg_ctx_00,(uint32_t)lVar6,uStack_50,size,uVar5,uVar5,off_rm,
                     (gen_helper_gvec_3_conflict1 *)fn_gvec_ptr);
        }
        else {
          if (bVar3) {
            local_70 = tcg_ctx_00->cpu_env;
          }
          else {
            local_70 = get_fpstatus_ptr_aarch64(tcg_ctx_00,1);
          }
          lVar6 = vfp_reg_offset(true,rm);
          tcg_gen_gvec_3_ptr_aarch64
                    (tcg_ctx_00,(uint32_t)lVar6,uStack_50,size,local_70,uVar5,uVar5,off_rm,_rn);
          if (!bVar3) {
            tcg_temp_free_ptr(tcg_ctx_00,local_70);
          }
        }
        s_local._4_4_ = 0;
      }
    }
    else {
      tVar1 = s->pc_curr;
      uVar5 = syn_simd_access_trap(1,0xe,false);
      gen_exception_insn(s,(uint32_t)tVar1,1,uVar5,s->fp_excp_el);
      s_local._4_4_ = 0;
    }
  }
  else {
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

static int disas_neon_insn_3same_ext(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_gvec_3 *fn_gvec = NULL;
    gen_helper_gvec_3_ptr *fn_gvec_ptr = NULL;
    int rd, rn, rm, opr_sz;
    int data = 0;
    int off_rn, off_rm;
    bool is_long = false, q = extract32(insn, 6, 1);
    bool ptr_is_env = false;

    if ((insn & 0xfe200f10) == 0xfc200800) {
        /* VCMLA -- 1111 110R R.1S .... .... 1000 ...0 .... */
        int size = extract32(insn, 20, 1);
        data = extract32(insn, 23, 2); /* rot */
        if (!dc_isar_feature(aa32_vcma, s)
            || (!size && !dc_isar_feature(aa32_fp16_arith, s))) {
            return 1;
        }
        fn_gvec_ptr = size ? gen_helper_gvec_fcmlas : gen_helper_gvec_fcmlah;
    } else if ((insn & 0xfea00f10) == 0xfc800800) {
        /* VCADD -- 1111 110R 1.0S .... .... 1000 ...0 .... */
        int size = extract32(insn, 20, 1);
        data = extract32(insn, 24, 1); /* rot */
        if (!dc_isar_feature(aa32_vcma, s)
            || (!size && !dc_isar_feature(aa32_fp16_arith, s))) {
            return 1;
        }
        fn_gvec_ptr = size ? gen_helper_gvec_fcadds : gen_helper_gvec_fcaddh;
    } else if ((insn & 0xfeb00f00) == 0xfc200d00) {
        /* V[US]DOT -- 1111 1100 0.10 .... .... 1101 .Q.U .... */
        bool u = extract32(insn, 4, 1);
        if (!dc_isar_feature(aa32_dp, s)) {
            return 1;
        }
        fn_gvec = u ? gen_helper_gvec_udot_b : gen_helper_gvec_sdot_b;
    } else if ((insn & 0xff300f10) == 0xfc200810) {
        /* VFM[AS]L -- 1111 1100 S.10 .... .... 1000 .Q.1 .... */
        int is_s = extract32(insn, 23, 1);
        if (!dc_isar_feature(aa32_fhm, s)) {
            return 1;
        }
        is_long = true;
        data = is_s; /* is_2 == 0 */
        fn_gvec_ptr = gen_helper_gvec_fmlal_a32;
        ptr_is_env = true;
    } else {
        return 1;
    }

    VFP_DREG_D(rd, insn);
    if (rd & q) {
        return 1;
    }
    if (q || !is_long) {
        VFP_DREG_N(rn, insn);
        VFP_DREG_M(rm, insn);
        if ((rn | rm) & q & !is_long) {
            return 1;
        }
        off_rn = vfp_reg_offset(1, rn);
        off_rm = vfp_reg_offset(1, rm);
    } else {
        rn = VFP_SREG_N(insn);
        rm = VFP_SREG_M(insn);
        off_rn = vfp_reg_offset(0, rn);
        off_rm = vfp_reg_offset(0, rm);
    }

    if (s->fp_excp_el) {
        gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                           syn_simd_access_trap(1, 0xe, false), s->fp_excp_el);
        return 0;
    }
    if (!s->vfp_enabled) {
        return 1;
    }

    opr_sz = (1 + q) * 8;
    if (fn_gvec_ptr) {
        TCGv_ptr ptr;
        if (ptr_is_env) {
            ptr = tcg_ctx->cpu_env;
        } else {
            ptr = get_fpstatus_ptr(tcg_ctx, 1);
        }
        tcg_gen_gvec_3_ptr(tcg_ctx, vfp_reg_offset(1, rd), off_rn, off_rm, ptr,
                           opr_sz, opr_sz, data, fn_gvec_ptr);
        if (!ptr_is_env) {
            tcg_temp_free_ptr(tcg_ctx, ptr);
        }
    } else {
        tcg_gen_gvec_3_ool(tcg_ctx, vfp_reg_offset(1, rd), off_rn, off_rm,
                           opr_sz, opr_sz, data, fn_gvec);
    }
    return 0;
}